

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yabmpinfo.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  code *pcVar11;
  optparse *poVar12;
  optparse *poVar13;
  code *pcVar14;
  char *pcVar15;
  undefined4 uVar16;
  byte bVar17;
  yabmp_info *l_info;
  optparse optparsecpy;
  optparse optparse;
  char *local_118;
  yabmp_info *local_110;
  undefined4 local_104;
  optparse local_100;
  optparse local_98;
  
  __stream = _stdout;
  bVar17 = 0;
  pcVar15 = *argv;
  pcVar5 = strrchr(pcVar15,0x2f);
  if (pcVar5 != (char *)0x0) {
    pcVar15 = pcVar5;
  }
  *argv = pcVar15 + (pcVar5 != (char *)0x0);
  optparse_init(&local_98,argv);
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  local_118 = (char *)0x0;
  while( true ) {
    while (iVar4 = optparse_long(&local_98,main::options,(int *)0x0), 0x6e < iVar4) {
      if (iVar4 == 0x6f) {
        local_118 = local_98.optarg;
      }
      else if (iVar4 == 0x71) {
        bVar3 = true;
      }
      else if (iVar4 == 0x76) {
        bVar2 = true;
        bVar3 = false;
      }
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x68) {
      bVar3 = false;
      bVar1 = true;
    }
    else if (iVar4 == 0x3f) {
      main_cold_1();
LAB_0010272e:
      iVar4 = 1;
      bVar1 = false;
      pcVar15 = local_118;
      uVar16 = 0;
LAB_00102738:
      if (((__stream != (FILE *)0x0) && (__stream != _stdout)) &&
         (fclose(__stream), !bVar1 && (char)uVar16 == '\0')) {
        remove(pcVar15);
        iVar4 = 1;
      }
      return iVar4;
    }
  }
  pcVar15 = (char *)0x0;
  if (!bVar1) {
    pcVar15 = local_118;
  }
  if ((pcVar15 != (char *)0x0) &&
     (((*pcVar15 != '-' || (pcVar15[1] != '\0')) &&
      (__stream = fopen(pcVar15,"wt"), __stream == (FILE *)0x0)))) {
    if (bVar3) {
      return 1;
    }
    fprintf(_stderr,"Can\'t open file %s for writing\n",pcVar15);
    return 1;
  }
  if (bVar2) {
    pcVar5 = *argv;
    uVar6 = yabmp_get_version_string();
    fprintf(__stream,"%s %s\n",pcVar5,uVar6);
  }
  if (bVar1) {
    pcVar15 = *argv;
    iVar4 = 0;
    fprintf(_stdout,
            "usage:\n%s -h|--help : this help message\n%s -v|--version : print version\n%s [-vqo output] file1 [file2 ...]\n  -v, --version: print version before info\n  -q, --quiet:   no error/warning printed\n  -o, --output:  output filename\n"
            ,pcVar15,pcVar15,pcVar15);
    bVar1 = true;
    pcVar15 = (char *)0x0;
    uVar16 = 0;
    goto LAB_00102738;
  }
  pcVar5 = optparse_arg(&local_98);
  if (pcVar5 == (char *)0x0) {
    if (!bVar2) {
      if (!bVar3) {
        main_cold_2();
      }
      goto LAB_0010272e;
    }
    iVar4 = 0;
    bVar1 = true;
    pcVar15 = local_118;
    uVar16 = 0;
    goto LAB_00102738;
  }
  poVar12 = &local_98;
  poVar13 = &local_100;
  for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
    poVar13->argv = poVar12->argv;
    poVar12 = (optparse *)((long)poVar12 + ((ulong)bVar17 * -2 + 1) * 8);
    poVar13 = (optparse *)((long)poVar13 + (ulong)bVar17 * -0x10 + 8);
  }
  pcVar7 = optparse_arg(&local_100);
  local_104 = (undefined4)CONCAT71((int7)((ulong)pcVar7 >> 8),pcVar7 != (char *)0x0);
  pcVar11 = print_error;
  if (bVar3) {
    pcVar11 = (code *)0x0;
  }
  pcVar14 = print_warning;
  if (bVar3) {
    pcVar14 = (code *)0x0;
  }
  pcVar9 = (char *)0x0;
  while( true ) {
    local_100.argv = (char **)0x0;
    local_110 = (yabmp_info *)0x0;
    if (pcVar7 != (char *)0x0) {
      if (pcVar9 != (char *)0x0) {
        fputc(10,__stream);
      }
      pcVar8 = strrchr(pcVar5,0x2f);
      pcVar9 = pcVar8;
      if (pcVar8 == (char *)0x0) {
        pcVar9 = pcVar5;
      }
      fprintf(__stream,"%s:\n",pcVar9 + (pcVar8 != (char *)0x0));
      pcVar9 = pcVar5;
    }
    iVar4 = yabmp_create_reader(&local_100,0,pcVar11,pcVar14,0,0,0);
    if ((iVar4 != 0) || (iVar4 = yabmp_create_info(local_100.argv,&local_110), iVar4 != 0)) break;
    if ((*pcVar5 == '-') && (pcVar5[1] == '\0')) {
      yabmp_set_input_stream(local_100.argv,_stdin,yabmp_file_read,0);
    }
    else {
      iVar4 = yabmp_set_input_file(local_100.argv,pcVar5);
      if (iVar4 != 0) break;
    }
    iVar4 = yabmp_read_info(local_100.argv,local_110);
    if (iVar4 != 0) break;
    yabmp_printinfo((FILE *)__stream,(yabmp *)local_100.argv,local_110);
    yabmp_destroy_reader(&local_100);
    pcVar5 = optparse_arg(&local_98);
    if (pcVar5 == (char *)0x0) {
      iVar4 = 0;
      bVar1 = true;
      uVar16 = local_104;
      goto LAB_00102738;
    }
  }
  yabmp_destroy_reader(&local_100,&local_110);
  iVar4 = 1;
  bVar1 = false;
  uVar16 = local_104;
  goto LAB_00102738;
}

Assistant:

int main(int argc, char* argv[])
{
	static const struct optparse_long options[] = {
		{ "version", 'v', OPTPARSE_NONE },
		{ "help",    'h', OPTPARSE_NONE },
		{ "quiet",   'q', OPTPARSE_NONE },
		{ "output",  'o', OPTPARSE_REQUIRED },
		{ 0 }
	};
	int result = EXIT_SUCCESS;
	int has_multiple_files = 0;
	struct optparse optparse;
	int option;
	struct {
		unsigned int version:1;
		unsigned int help:1;
		unsigned int quiet:1;
	} flags = {0};
	const char* output = NULL;
	const char* input = NULL;
	const char* last_input = NULL;
	FILE* outStream = stdout;
	
	argv[0] = (char*)yabmp_basename(argv[0]);
	
	optparse_init(&optparse, argv);
	
	while ((option = optparse_long(&optparse, options, NULL)) != -1) {
		switch (option) {
			case 'v':
				flags.version = 1;
				break;
			case 'h':
				flags.help = 1;
				break;
			case 'q':
				flags.quiet = 1;
				break;
			case 'o':
				output = optparse.optarg;
				break;
			case '?':
				fprintf(stderr, "%s: %s\n", argv[0], optparse.errmsg);
				print_usage(stderr, argv[0]);
				result = 1;
				goto BADEND;
		}
	}
	
	if (flags.help) {
		output = NULL;
	}
	
	if ((output != NULL) && (strcmp(output, "-") != 0)) {
		outStream = fopen(output, "wt");
		if (outStream == NULL) {
			if (!flags.quiet) {
				fprintf(stderr, "Can't open file %s for writing\n", output);
			}
			result = 1;
			goto BADEND;
		}
	}
	
	if (flags.version) {
		fprintf(outStream, "%s %s\n", argv[0], yabmp_get_version_string());
	}
	if (flags.help) {
		print_usage(stdout, argv[0]);
		goto BADEND;
	}
	
	input = optparse_arg(&optparse);
	if (input == NULL) {
		if (!flags.version) {
			if (!flags.quiet) {
				fprintf(stderr, "%s: missing file1 argument\n", argv[0]);
				print_usage(stderr, argv[0]);
			}
			result = 1;
		}
		goto BADEND;
	}
	
	/* Check for multiple files */
	{
		struct optparse optparsecpy;
		memcpy(&optparsecpy, &optparse, sizeof(optparse));
		if (optparse_arg(&optparsecpy) != NULL) {
			has_multiple_files = 1;
		}
	}
	
	do
	{
		yabmp* l_reader = NULL;
		yabmp_info* l_info = NULL;
		
		if (has_multiple_files) {
			if (last_input != NULL) {
				fputc('\n', outStream);
			}
			last_input = input;
			fprintf(outStream, "%s:\n", yabmp_basename(input));
		}
		if (yabmp_create_reader(&l_reader, NULL, flags.quiet ? NULL : print_error, flags.quiet ? NULL : print_warning, NULL, NULL, NULL) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if (yabmp_create_info(l_reader, &l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		if ((input[0] == '-') && (input[1] == '\0')) {
			stream_setmode_binary(stdin, flags.quiet);
			/* This can't fail with proper arguments */
			(void)yabmp_set_input_stream(l_reader, stdin, yabmp_file_read, NULL, NULL);
		} else {
			if (yabmp_set_input_file(l_reader, input) != YABMP_OK) {
				result = 1;
				goto FREE_INSTANCE;
			}
		}
		if (yabmp_read_info(l_reader, l_info) != YABMP_OK) {
			result = 1;
			goto FREE_INSTANCE;
		}
		yabmp_printinfo(outStream, l_reader, l_info);
FREE_INSTANCE:
		yabmp_destroy_reader(&l_reader, &l_info);
		if (result) {
			goto BADEND;
		}
	} while ((input = optparse_arg(&optparse)) != NULL);
BADEND:
	if ((outStream != stdout) && (outStream != NULL)) {
		fclose(outStream);
		if (result && !has_multiple_files) {
			(void)remove(output);
		}
	}
	
	return result;
}